

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UChar32 utext_char32At_63(UText *ut,int64_t nativeIndex)

{
  uint local_24;
  UChar32 c;
  int64_t nativeIndex_local;
  UText *ut_local;
  
  local_24 = 0xffffffff;
  if ((ut->chunkNativeStart <= nativeIndex) &&
     (nativeIndex < ut->chunkNativeStart + (long)ut->nativeIndexingLimit)) {
    ut->chunkOffset = (int)nativeIndex - (int)ut->chunkNativeStart;
    local_24 = (uint)(ushort)ut->chunkContents[ut->chunkOffset];
    if ((local_24 & 0xfffff800) != 0xd800) {
      return local_24;
    }
  }
  utext_setNativeIndex_63(ut,nativeIndex);
  if (((ut->chunkNativeStart <= nativeIndex) && (ut->chunkOffset < ut->chunkLength)) &&
     (local_24 = (uint)(ushort)ut->chunkContents[ut->chunkOffset], (local_24 & 0xfffff800) == 0xd800
     )) {
    local_24 = utext_current32_63(ut);
  }
  return local_24;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_char32At(UText *ut, int64_t nativeIndex) {
    UChar32 c = U_SENTINEL;

    // Fast path the common case.
    if (nativeIndex>=ut->chunkNativeStart && nativeIndex < ut->chunkNativeStart + ut->nativeIndexingLimit) {
        ut->chunkOffset = (int32_t)(nativeIndex - ut->chunkNativeStart);
        c = ut->chunkContents[ut->chunkOffset];
        if (U16_IS_SURROGATE(c) == FALSE) {
            return c;
        }
    }


    utext_setNativeIndex(ut, nativeIndex);
    if (nativeIndex>=ut->chunkNativeStart && ut->chunkOffset<ut->chunkLength) {
        c = ut->chunkContents[ut->chunkOffset];
        if (U16_IS_SURROGATE(c)) {
            // For surrogates, let current32() deal with the complications
            //    of supplementaries that may span chunk boundaries.
            c = utext_current32(ut);
        }
    }
    return c;
}